

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

uint __thiscall ON_NurbsSurface::SizeOf(ON_NurbsSurface *this)

{
  uint uVar1;
  
  uVar1 = ON_Surface::SizeOf(&this->super_ON_Surface);
  return uVar1 + (this->m_knot_capacity[1] + this->m_knot_capacity[0] + this->m_cv_capacity) * 8 +
         0x48;
}

Assistant:

unsigned int ON_NurbsSurface::SizeOf() const
{
  unsigned int sz = ON_Surface::SizeOf();
  sz += (sizeof(*this) - sizeof(ON_Surface));
  sz += m_knot_capacity[0]*sizeof(*m_knot[0]);
  sz += m_knot_capacity[1]*sizeof(*m_knot[1]);
  sz += m_cv_capacity*sizeof(*m_cv);
  return sz;
}